

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmath.c
# Opt level: O3

void print_unicode(uint64_t num,_Bool uppercase_hex,encoding_t to_unicode)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  char *__format;
  uint64_t local_80;
  uint64_t *local_78;
  char *utf8_input;
  char *to_unicode_input;
  size_t in_size;
  size_t in_bytes_size;
  char utf8_buf [8];
  char *utf8;
  char to_unicode_buf [8];
  char *to_unicode_bytes;
  size_t utf8_size;
  size_t to_unicode_size;
  
  local_78 = &local_80;
  to_unicode_input = (char *)0x8;
  in_size = 8;
  utf8_buf = (char  [8])&in_bytes_size;
  in_bytes_size = 0;
  to_unicode_buf = (char  [8])&utf8;
  utf8 = (char *)0x0;
  to_unicode_bytes = (char *)0x8;
  utf8_size = 8;
  uVar3 = (ulong)to_unicode;
  local_80 = num;
  utf8_input = (char *)local_78;
  printf("%s: ",to_encoding_pretty_print_lookup_rel +
                *(int *)(to_encoding_pretty_print_lookup_rel + uVar3 * 4));
  if (num < 0x1f) {
    pcVar4 = "<special> ";
  }
  else {
    sVar2 = iconv(iconv_descriptors[0],(char **)&local_78,(size_t *)&to_unicode_input,
                  (char **)utf8_buf,(size_t *)&to_unicode_bytes);
    if (sVar2 != 0xffffffffffffffff) {
      printf("%s ",&in_bytes_size);
      goto LAB_0010b26a;
    }
    pcVar4 = "<invalid> ";
  }
  fputs(pcVar4,stdout);
LAB_0010b26a:
  sVar2 = iconv(iconv_descriptors[uVar3],&utf8_input,&in_size,(char **)to_unicode_buf,&utf8_size);
  if (sVar2 == 0xffffffffffffffff) {
    pcVar4 = "<invalid>";
  }
  else {
    fputs("(0x",stdout);
    lVar1 = *(long *)(&DAT_001352d0 + uVar3 * 8);
    pcVar4 = ")";
    if (utf8_size + lVar1 != 8) {
      __format = "%0*lx";
      if (uppercase_hex) {
        __format = "%0*lX";
      }
      uVar3 = 0;
      do {
        printf(__format,2,(ulong)(byte)to_unicode_buf[uVar3 - 8]);
        uVar3 = uVar3 + 1;
      } while (uVar3 < 8 - (utf8_size + lVar1));
    }
  }
  puts(pcVar4);
  return;
}

Assistant:

static void print_unicode(uint64_t num, bool uppercase_hex,
			  enum encoding_t to_unicode)
{
	iconv_t cd;
	size_t conversion;

	char number_as_byte_array[8] = { 0 };
	char *utf8_input = number_as_byte_array;
	char *to_unicode_input = number_as_byte_array;
	size_t in_size = sizeof number_as_byte_array;
	size_t in_bytes_size = sizeof number_as_byte_array;

	char utf8_buf[8] = { 0 };
	char *utf8 = utf8_buf;
	char to_unicode_buf[8] = { 0 };
	char *to_unicode_bytes = to_unicode_buf;
	size_t utf8_size = sizeof utf8_buf;
	size_t to_unicode_size = sizeof to_unicode_buf;

	size_t offset[3] = { 1, 2, 4 };

	memcpy(&number_as_byte_array, &num, sizeof num);

	printf("%s: ", to_encoding_pretty_print_lookup[to_unicode]);

	// Convert to UTF-8
	if (num < 31) {
		fputs("<special> ", stdout);
	} else {
		cd = iconv_descriptors[UTF8];
		conversion =
			iconv(cd, &utf8_input, &in_size, &utf8, &utf8_size);

		if (conversion == (size_t)-1) {
			fputs("<invalid> ", stdout);
		} else {
			printf("%s ", utf8_buf);
		}
	}

	// Convert from_unicode to to_unicode
	cd = iconv_descriptors[to_unicode];
	conversion = iconv(cd, &to_unicode_input, &in_bytes_size,
			   &to_unicode_bytes, &to_unicode_size);

	if (conversion == (size_t)-1) {
		puts("<invalid>");
		return;
	}

	fputs("(0x", stdout);

	/*
	 re: offset
	 This kind of works because iconv decrements the output buffer size, and we
	 know based on UTF8-16 if there's 1-2 null bytes at the end of our buffer,
	 and with UTF32, the null character is 4 bytes.
	 */
	for (size_t i = 0; i < 8 - (to_unicode_size + offset[to_unicode]);
	     i++) {
		__print_hex((uint64_t)0xff & to_unicode_buf[i], 2,
			    uppercase_hex);
	}

	puts(")");
}